

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GdlAttrValueSpec::FixGlyphAttrsInRules
          (GdlAttrValueSpec *this,GrcManager *pcman,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcInClasses,
          int irit,Symbol param_4)

{
  SymbolType SVar1;
  Symbol pGVar2;
  
  if (this->m_pexpValue != (GdlExpression *)0x0) {
    SVar1 = this->m_psymName->m_symt;
    (*this->m_pexpValue->_vptr_GdlExpression[0x12])();
    pGVar2 = (Symbol)0x0;
    if (SVar1 == ksymtFeature) {
      pGVar2 = this->m_psymName;
    }
    (*this->m_pexpValue->_vptr_GdlExpression[0xe])(this->m_pexpValue,0,pGVar2);
    return;
  }
  return;
}

Assistant:

void GdlAttrValueSpec::FixGlyphAttrsInRules(GrcManager * pcman,
	std::vector<GdlGlyphClassDefn *> & vpglfcInClasses, int irit, Symbol psymOutClass)
#endif
{
	Assert(psymOutClass->FitsSymbolType(ksymtClass) ||
		psymOutClass->FitsSymbolType(ksymtSpecialUnderscore) ||
		psymOutClass->FitsSymbolType(ksymtSpecialAt));

	SymbolType symtName = this->m_psymName->SymType();
	if (m_pexpValue)
	{
		m_pexpValue->CheckAndFixGlyphAttrsInRules(pcman, vpglfcInClasses, irit);
		m_pexpValue->LookupExpCheck(false, ((symtName == ksymtFeature) ? m_psymName : NULL));
	}
}